

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O3

int CVmObjString::getp_to_uni(vm_val_t *retval,vm_val_t *self_val,char *str,uint *in_argc)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  wchar_t wVar6;
  int32_t iVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  long lVar11;
  byte *pbVar12;
  size_t element_count;
  size_t idx;
  byte *pbVar13;
  bool bVar14;
  vm_val_t ele_val;
  vm_val_t local_40;
  
  if (in_argc == (uint *)0x0) {
    bVar14 = true;
  }
  else {
    bVar14 = *in_argc == 0;
  }
  if (getp_to_uni(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_to_uni();
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_to_uni::desc);
  pvVar4 = sp_;
  if (iVar5 != 0) {
    return 1;
  }
  if (bVar14) {
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    pbVar13 = (byte *)(str + 2);
    element_count = 0;
    if ((ulong)*(ushort *)str != 0) {
      pbVar10 = pbVar13;
      do {
        pbVar10 = pbVar10 + (ulong)(((*pbVar10 >> 5 & 1) != 0) + 1 & (uint)(*pbVar10 >> 7) * 3) + 1;
        element_count = element_count + 1;
      } while (pbVar10 < str + (ulong)*(ushort *)str + 2);
    }
    idx = 0;
    wVar6 = CVmObjList::create(0,element_count);
    if (element_count != 0) {
      pCVar1 = G_obj_table_X.pages_[(uint)wVar6 >> 0xc];
      do {
        local_40.val.intval = utf8_ptr::s_getch((char *)pbVar13);
        local_40.typ = VM_INT;
        CVmObjList::cons_set_element
                  ((CVmObjList *)((long)&pCVar1->ptr_ + (ulong)(uint)((wVar6 & 0xfffU) * 0x18)),idx,
                   &local_40);
        idx = idx + 1;
        pbVar13 = pbVar13 + (ulong)(((*pbVar13 >> 5 & 1) != 0) + 1 & (uint)(*pbVar13 >> 7) * 3) + 1;
      } while (element_count != idx);
    }
    retval->typ = VM_OBJ;
  }
  else {
    iVar7 = CVmBif::pop_long_val();
    pvVar4 = sp_;
    uVar8 = (ulong)iVar7;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    pbVar13 = (byte *)(ulong)*(ushort *)str;
    pbVar10 = (byte *)(str + 2);
    if (iVar7 < 0) {
      lVar11 = 0;
      if (pbVar13 != (byte *)0x0) {
        pbVar12 = pbVar10;
        do {
          pbVar12 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) +
                              1;
          lVar11 = lVar11 + 1;
        } while (pbVar12 < pbVar10 + (long)pbVar13);
      }
      uVar8 = uVar8 + lVar11 + 1;
    }
    bVar14 = pbVar13 != (byte *)0x0;
    uVar9 = uVar8;
    pbVar12 = pbVar10;
    if (1 < (long)uVar8 && bVar14) {
      do {
        uVar8 = uVar9 - 1;
        pbVar10 = pbVar12 + (ulong)(((*pbVar12 >> 5 & 1) != 0) + 1 & (uint)(*pbVar12 >> 7) * 3) + 1;
        pbVar13 = pbVar12 + ((long)pbVar13 - (long)pbVar10);
        bVar14 = pbVar13 != (byte *)0x0;
        if (uVar9 < 3) break;
        uVar9 = uVar8;
        pbVar12 = pbVar10;
      } while (pbVar13 != (byte *)0x0);
    }
    if ((uVar8 != 1) || (!bVar14)) {
      retval->typ = VM_NIL;
      goto LAB_002b4d17;
    }
    wVar6 = utf8_ptr::s_getch((char *)pbVar10);
    retval->typ = VM_INT;
  }
  (retval->val).obj = wVar6;
LAB_002b4d17:
  sp_ = sp_ + -1;
  return 1;
}

Assistant:

int CVmObjString::getp_to_uni(VMG_ vm_val_t *retval,
                              const vm_val_t *self_val,
                              const char *str, uint *in_argc)
{
    size_t bytelen;
    long idx = 1;
    utf8_ptr p;

    /* check arguments */
    uint argc = (in_argc != 0 ? *in_argc : 0);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* retrieve the index argument if present */
    if (argc >= 1)
        idx = CVmBif::pop_long_val(vmg0_);

    /* push a self-reference as GC protection */
    G_stk->push(self_val);

    /* get and skip the string's length prefix */
    bytelen = vmb_get_len(str);
    str += VMB_LEN;

    /* set up a utf8 pointer to the string */
    p.set((char *)str);

    /* if the index is negative, it's an index from the end of the string */
    if (idx < 0)
        idx += p.len(bytelen) + 1;

    /* check for an index argument */
    if (argc >= 1)
    {
        /* skip through the string until we get to the desired index */
        for ( ; idx > 1 && bytelen != 0 ; --idx, p.inc(&bytelen)) ;

        /* check to see if we have a character available */
        if (idx == 1 && bytelen != 0)
        {
            /* the index is valid - return the character here */
            retval->set_int((long)p.getch());
        }
        else
        {
            /* 
             *   the index is past the end of the string or is less than 1
             *   - return nil to indicate that there's no character here 
             */
            retval->set_nil();
        }
    }
    else
    {
        size_t charlen;
        vm_obj_id_t lst_obj;
        CVmObjList *lst;
        size_t i;

        /* 
         *   There's no index argument - they want a list of all of the
         *   code points in the string.  First, get the number of
         *   characters in the string.  
         */
        charlen = p.len(bytelen);

        /* create a list to hold the results */
        lst_obj = CVmObjList::create(vmg_ FALSE, charlen);
        lst = (CVmObjList *)vm_objp(vmg_ lst_obj);

        /* set the list's elements to the unicode characters values */
        for (i = 0 ; i < charlen ; ++i, p.inc())
        {
            wchar_t ch;
            vm_val_t ele_val;

            /* get this character */
            ch = p.getch();

            /* set this list element */
            ele_val.set_int((long)ch);
            lst->cons_set_element(i, &ele_val);
        }

        /* return the list object */
        retval->set_obj(lst_obj);
    }
    
    /* discard the GC protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}